

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

int bhito(obj *obj,obj *otmp)

{
  char cVar1;
  short sVar2;
  boolean bVar3;
  uint uVar4;
  undefined8 in_RAX;
  obj *o;
  char *pcVar5;
  obj *poVar6;
  monst *pmVar7;
  int iVar8;
  int iVar9;
  xchar xVar10;
  xchar xVar11;
  long lVar12;
  xchar oox;
  xchar ooy;
  undefined8 uStack_38;
  xchar oox_1;
  
  if ((*(uint *)&obj->field_0x4a >> 0x1a & 1) != 0) {
    if (flags.bypasses != '\0') {
      return 0;
    }
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfbffffff;
  }
  uStack_38 = in_RAX;
  if ((obj->where != '\x01') && (otmp->otyp != 0x1a4)) {
    warning("bhito: obj is not floor or Stone To Flesh spell");
  }
  iVar9 = 0;
  if (uball == obj) {
    return 0;
  }
  sVar2 = otmp->otyp;
  if (uchain == obj) {
    if ((sVar2 != 0x1cc) && (sVar2 != 0x186)) {
      return 0;
    }
    unpunish();
    iVar9 = (int)otmp->otyp;
LAB_0027c6d4:
    iVar8 = 1;
    goto LAB_0027c9a7;
  }
  switch(sVar2) {
  case 0x1c3:
  case 0x1c6:
  case 0x1c7:
    goto switchD_0027c6a3_caseD_185;
  case 0x1c4:
switchD_0027c6a3_caseD_187:
    if (obj->otyp == 0x215) {
      break_statue(obj);
    }
    else {
      if (obj->otyp != 0x214) {
        if (flags.mon_moving == '\0') {
          iVar8 = 0;
          hero_breaks(obj,obj->ox,obj->oy,'\0');
        }
        else {
          breaks(obj,obj->ox,obj->oy);
          iVar8 = 0;
        }
        goto LAB_0027c99d;
      }
      fracture_rock(obj);
    }
    iVar8 = 1;
    goto LAB_0027c99d;
  case 0x1c5:
    break;
  case 0x1c8:
switchD_0027c737_caseD_19d:
    if (obj->otyp != 0x10f) {
      pmVar7 = revive(obj);
      return (uint)(pmVar7 != (monst *)0x0);
    }
    revive_egg(obj);
    break;
  case 0x1c9:
switchD_0027c737_caseD_19e:
    sVar2 = obj->otyp;
    if (sVar2 == 0xcf) {
      return 0;
    }
    if (sVar2 == 0x13a) {
      return 0;
    }
    if (sVar2 == 0x19e) {
      return 0;
    }
    if (sVar2 == 0x1c9) {
      return 0;
    }
    bVar3 = obj_resists(obj,5,0x5f);
    if (bVar3 != '\0') {
      return 0;
    }
    u.uconduct.polypiles = u.uconduct.polypiles + 1;
    if ((ushort)(obj->otyp - 0xdaU) < 3) {
      boxlock(obj,otmp);
    }
    uVar4 = 3;
    if ((obj->oclass != '\v') && ((*(uint *)&obj->field_0x4a & 1) == 0)) {
      uVar4 = (*(uint *)&obj->field_0x4a & 2) * 2 + 8;
    }
    iVar9 = rn2(uVar4 >> (4 < obj->quan));
    if (iVar9 != 0) {
      obj = poly_obj(obj,0);
      if ((obj->where == '\x01') && (obj->otyp == 0x214)) {
        block_point((int)obj->ox,(int)obj->oy);
      }
      goto LAB_0027c857;
    }
    if ((viz_array[obj->oy][obj->ox] & 2U) != 0) {
      discover_object((int)otmp->otyp,'\x01','\x01');
    }
    obj_zapped = 1;
    if (poly_zapped < 0) {
      lVar12 = (long)obj->quan + 1;
      do {
        lVar12 = lVar12 + -1;
        if (lVar12 == 0) goto LAB_0027cb19;
        iVar9 = rn2((int)u.uluck + (int)u.moreluck + 0x2d);
      } while (iVar9 != 0);
      poly_zapped = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
    }
LAB_0027cb19:
    uVar4 = obj->quan;
    if (1 < (int)uVar4) {
      iVar9 = 30000;
      if (uVar4 < 0x8000) {
        iVar9 = uVar4 - 1;
      }
      uVar4 = rnd(iVar9);
      obj = splitobj(obj,(ulong)uVar4);
    }
    bVar3 = costly_spot(obj->ox,obj->oy);
    if (bVar3 != '\0') {
      if (u.ushops[0] == '\0') {
        stolen_value(obj,obj->ox,obj->oy,'\0','\0');
      }
      else {
        addtobill(obj,'\0','\0','\0');
      }
    }
    delobj(obj);
    break;
  case 0x1ca:
switchD_0027c737_caseD_1a1:
    cancel_item(obj);
LAB_0027c857:
    newsym((int)obj->ox,(int)obj->oy);
    break;
  case 0x1cb:
switchD_0027c737_caseD_19f:
    rloco(obj);
    break;
  case 0x1cc:
  case 0x1cd:
switchD_0027c6a3_caseD_186:
    if (2 < (ushort)(obj->otyp - 0xdaU)) {
      return 0;
    }
    bVar3 = boxlock(obj,otmp);
    if (bVar3 == '\0') {
      return 0;
    }
    iVar8 = (int)bVar3;
LAB_0027c99d:
    iVar9 = (int)otmp->otyp;
LAB_0027c9a7:
    discover_object(iVar9,'\x01','\x01');
    return iVar8;
  case 0x1ce:
    uVar4 = *(uint *)&obj->field_0x4a;
    *(uint *)&obj->field_0x4a = uVar4 | 0x20;
    if (((ushort)obj->otyp - 0xda < 8) || (obj->otyp == 0x215)) {
      poVar6 = obj->cobj;
      if (poVar6 == (obj *)0x0) {
        pcVar5 = Tobjnam(obj,"are");
        pline("%s empty.",pcVar5);
      }
      else {
        for (; poVar6 != (obj *)0x0; poVar6 = poVar6->nobj) {
          poVar6->field_0x4a = poVar6->field_0x4a | 0x20;
        }
        display_cinventory(obj);
      }
    }
    else if ((uVar4 & 0x20) != 0) {
      return 0;
    }
    iVar9 = 0x1ce;
    goto LAB_0027c6d4;
  default:
    switch(sVar2) {
    case 0x185:
    case 0x18b:
      goto switchD_0027c6a3_caseD_185;
    case 0x186:
    case 0x18c:
      goto switchD_0027c6a3_caseD_186;
    case 0x187:
      goto switchD_0027c6a3_caseD_187;
    case 0x188:
    case 0x189:
switchD_0027c6a3_caseD_188:
      warning("What an interesting effect (%d)");
      break;
    case 0x18a:
      drain_item(obj);
      break;
    default:
      switch(sVar2) {
      case 0x196:
        goto switchD_0027c6a3_caseD_185;
      default:
        goto switchD_0027c6a3_caseD_188;
      case 0x19d:
        goto switchD_0027c737_caseD_19d;
      case 0x19e:
        goto switchD_0027c737_caseD_19e;
      case 0x19f:
        goto switchD_0027c737_caseD_19f;
      case 0x1a1:
        goto switchD_0027c737_caseD_1a1;
      case 0x1a4:
        sVar2 = obj->otyp;
        if ((*(ushort *)&objects[sVar2].field_0x11 & 0x1e0) != 0x140) {
          return 0;
        }
      }
      xVar11 = obj->ox;
      xVar10 = obj->oy;
      iVar9 = 0;
      switch(objects[sVar2].oc_class) {
      case '\x04':
        iVar9 = 0x113;
        break;
      default:
        goto switchD_0027c93d_caseD_5;
      case '\x06':
        iVar9 = 0;
        if (sVar2 == 0xf6) {
          uVar4 = obj->corpsenm;
          cVar1 = mons[(int)uVar4].mlet;
          if (((cVar1 != '\x02') && (cVar1 != '\n')) && ((cVar1 != '\x16' && (cVar1 != '\x19')))) {
            if (cVar1 == '7') {
              if ((uVar4 | 2) == 0x106) goto LAB_0027cc4b;
            }
            else if (cVar1 != ' ') {
              if (cVar1 == '*') {
                if (uVar4 == 0xd6) goto LAB_0027cc4b;
              }
              else if ((cVar1 != '6') && ((cVar1 != '\x1f' || (uVar4 == 0x9e)))) {
LAB_0027cc4b:
                get_obj_location(obj,&oox,(xchar *)((long)register0x00000020 + -0x34),0);
                pmVar7 = makemon(mons + (int)uVar4,level,(int)oox,(int)uStack_38._4_1_,0);
                xVar11 = oox;
                xVar10 = uStack_38._4_1_;
                if (pmVar7 == (monst *)0x0) {
LAB_0027cd01:
                  iVar9 = 0;
                  if ((mons[obj->corpsenm].geno & 0x1010) == 0) {
                    while (poVar6 = obj->cobj, poVar6 != (obj *)0x0) {
                      obj_extract_self(poVar6);
                      place_object(poVar6,level,(int)xVar11,(int)xVar10);
                    }
                    poly_obj(obj,0x10e);
                    goto LAB_0027cdbc;
                  }
                }
                else {
                  delobj(obj);
                  iVar9 = 1;
                  if ((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) {
                    pline("The figurine animates!");
                  }
                }
                goto switchD_0027c93d_caseD_5;
              }
            }
          }
          goto switchD_0027c93d_caseD_d;
        }
        goto switchD_0027c93d_caseD_5;
      case '\v':
        iVar9 = 0x111;
        break;
      case '\r':
switchD_0027c93d_caseD_d:
        iVar9 = 0x110;
        break;
      case '\x0e':
        if (sVar2 != 0x215) {
          if (sVar2 == 0x214) {
            iVar9 = 0x112;
            break;
          }
          goto switchD_0027c93d_caseD_5;
        }
        get_obj_location(obj,&oox_1,&ooy,0);
        uVar4 = obj->corpsenm;
        cVar1 = mons[(int)uVar4].mlet;
        xVar11 = oox_1;
        xVar10 = ooy;
        if ((((cVar1 == '\x02') || (cVar1 == '\n')) || (cVar1 == '\x16')) || (cVar1 == '\x19'))
        goto switchD_0027c93d_caseD_d;
        if (cVar1 == '7') {
          if ((uVar4 | 2) == 0x106) goto LAB_0027cce2;
          goto switchD_0027c93d_caseD_d;
        }
        if (cVar1 == ' ') goto switchD_0027c93d_caseD_d;
        if (cVar1 != '*') {
          if ((cVar1 != '6') && ((cVar1 != '\x1f' || (uVar4 == 0x9e)))) goto LAB_0027cce2;
          goto switchD_0027c93d_caseD_d;
        }
        if (uVar4 != 0xd6) goto switchD_0027c93d_caseD_d;
LAB_0027cce2:
        pmVar7 = animate_statue(obj,oox_1,ooy,2,(int *)0x0);
        if (pmVar7 == (monst *)0x0) goto LAB_0027cd01;
        goto LAB_0027cdbc;
      }
      poly_obj(obj,iVar9);
      if ((((youmonst.data)->mflags1 >> 0x1e & 1) == 0) ||
         (((((youmonst.data)->mflags1 >> 0x1d & 1) != 0 && (urole.malenum != 0x160)) &&
          (u.uconduct.unvegetarian != 0)))) {
        pcVar5 = "You smell a delicious smell.";
      }
      else {
        pcVar5 = "You smell the odor of meat.";
      }
      Norep(pcVar5);
LAB_0027cdbc:
      iVar9 = 1;
switchD_0027c93d_caseD_5:
      newsym((int)xVar11,(int)xVar10);
      goto switchD_0027c6a3_caseD_185;
    }
  }
  iVar9 = 1;
switchD_0027c6a3_caseD_185:
  return iVar9;
}

Assistant:

int bhito(struct obj *obj, struct obj *otmp)
{
	int res = 1;	/* affected object by default */

	if (obj->bypass) {
		/* The bypass bit is currently only used as follows:
		 *
		 * POLYMORPH - When a monster being polymorphed drops something
		 *             from its inventory as a result of the change.
		 *             If the items fall to the floor, they are not
		 *             subject to direct subsequent polymorphing
		 *             themselves on that same zap. This makes it
		 *             consistent with items that remain in the
		 *             monster's inventory. They are not polymorphed
		 *             either.
		 * UNDEAD_TURNING - When an undead creature gets killed via
		 *	       undead turning, prevent its corpse from being
		 *	       immediately revived by the same effect.
		 *
		 * The bypass bit on all objects is reset each turn, whenever
		 * flags.bypasses is set.
		 *
		 * We check the obj->bypass bit above AND flags.bypasses
		 * as a safeguard against any stray occurrence left in an obj
		 * struct someplace, although that should never happen.
		 */
		if (flags.bypasses)
			return 0;
		else
			obj->bypass = 0;
	}

	/*
	 * Some parts of this function expect the object to be on the floor
	 * obj->{ox,oy} to be valid.  The exception to this (so far) is
	 * for the STONE_TO_FLESH spell.
	 */
	if (!(obj->where == OBJ_FLOOR || otmp->otyp == SPE_STONE_TO_FLESH))
	    warning("bhito: obj is not floor or Stone To Flesh spell");

	if (obj == uball) {
		res = 0;
	} else if (obj == uchain) {
		if (otmp->otyp == WAN_OPENING || otmp->otyp == SPE_KNOCK) {
		    unpunish();
		    makeknown(otmp->otyp);
		} else
		    res = 0;
	} else
	switch(otmp->otyp) {
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
		if (obj->otyp == WAN_POLYMORPH ||
			obj->otyp == SPE_POLYMORPH ||
			obj->otyp == POT_POLYMORPH ||
			obj->otyp == AMULET_OF_UNCHANGING ||
			obj_resists(obj, 5, 95)) {
		    res = 0;
		    break;
		}
		/* KMH, conduct */
		u.uconduct.polypiles++;
		/* any saved lock context will be dangerously obsolete */
		if (Is_box(obj)) boxlock(obj, otmp);

		if (obj_shudders(obj)) {
		    if (cansee(obj->ox, obj->oy))
			makeknown(otmp->otyp);
		    do_osshock(obj);
		    break;
		}
		obj = poly_obj(obj, STRANGE_OBJECT);
		/* poly_obj doesn't block vision, do that ourselves now. */
		if (obj->where == OBJ_FLOOR && obj->otyp == BOULDER)
		    block_point(obj->ox, obj->oy);
		newsym(obj->ox,obj->oy);
		break;
	case WAN_PROBING:
		res = !obj->dknown;
		/* target object has now been "seen (up close)" */
		obj->dknown = 1;
		if (Is_container(obj) || obj->otyp == STATUE) {
		    if (!obj->cobj)
			pline("%s empty.", Tobjnam(obj, "are"));
		    else {
			struct obj *o;
			/* view contents (not recursively) */
			for (o = obj->cobj; o; o = o->nobj)
			    o->dknown = 1;	/* "seen", even if blind */
			display_cinventory(obj);
		    }
		    res = 1;
		}
		if (res) makeknown(WAN_PROBING);
		break;
	case WAN_STRIKING:
	case SPE_FORCE_BOLT:
		if (obj->otyp == BOULDER)
			fracture_rock(obj);
		else if (obj->otyp == STATUE)
			break_statue(obj);
		else {
			if (!flags.mon_moving)
			    hero_breaks(obj, obj->ox, obj->oy, FALSE);
			else
			    breaks(obj, obj->ox, obj->oy);
			res = 0;
		}
		/* BUG[?]: shouldn't this depend upon you seeing it happen? */
		makeknown(otmp->otyp);
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_item(obj);
		newsym(obj->ox,obj->oy);	/* might change color */
		break;
	case SPE_DRAIN_LIFE:
		drain_item(obj);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		rloco(obj);
		break;
	case WAN_MAKE_INVISIBLE:
#ifdef INVISIBLE_OBJECTS
		obj->oinvis = TRUE;
		newsym(obj->ox,obj->oy);	/* make object disappear */
#endif
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		if (obj->otyp == EGG)
			revive_egg(obj);
		else
			res = !!revive(obj);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		if (Is_box(obj))
			res = boxlock(obj, otmp);
		else
			res = 0;
		if (res /* && otmp->oclass == WAND_CLASS */)
			makeknown(otmp->otyp);
		break;
	case WAN_SLOW_MONSTER:		/* no effect on objects */
	case SPE_SLOW_MONSTER:
	case WAN_SPEED_MONSTER:
	case WAN_NOTHING:
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		res = 0;
		break;
	case SPE_STONE_TO_FLESH:
		res = hito_stone_to_flesh(obj);
		break;
	default:
		warning("What an interesting effect (%d)", otmp->otyp);
		break;
	}
	return res;
}